

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::ExistingFileMatchesProto
               (Edition edition,FileDescriptor *existing_file,FileDescriptorProto *proto)

{
  bool bVar1;
  __type_conflict1 _Var2;
  uint32_t *puVar3;
  Arena *arena;
  string local_180;
  string local_160;
  undefined1 local_130 [8];
  FileDescriptorProto existing_proto;
  FileDescriptorProto *proto_local;
  FileDescriptor *existing_file_local;
  Edition edition_local;
  
  existing_proto.field_0._224_8_ = proto;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_130);
  FileDescriptor::CopyTo(existing_file,(FileDescriptorProto *)local_130);
  if ((edition == EDITION_PROTO2) &&
     (bVar1 = FileDescriptorProto::has_syntax((FileDescriptorProto *)existing_proto.field_0._224_8_)
     , bVar1)) {
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        &existing_proto.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar3 = (byte)*puVar3 | 4;
    arena = MessageLite::GetArena((MessageLite *)local_130);
    internal::ArenaStringPtr::Set(&existing_proto.field_0._impl_.package_,"proto2",arena);
  }
  MessageLite::SerializeAsString_abi_cxx11_(&local_160,(MessageLite *)local_130);
  MessageLite::SerializeAsString_abi_cxx11_
            (&local_180,(MessageLite *)existing_proto.field_0._224_8_);
  _Var2 = std::operator==(&local_160,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_130);
  return _Var2;
}

Assistant:

PROTOBUF_NOINLINE static bool ExistingFileMatchesProto(
    Edition edition, const FileDescriptor* existing_file,
    const FileDescriptorProto& proto) {
  FileDescriptorProto existing_proto;
  existing_file->CopyTo(&existing_proto);
  if (edition == Edition::EDITION_PROTO2 && proto.has_syntax()) {
    existing_proto.set_syntax("proto2");
  }

  return existing_proto.SerializeAsString() == proto.SerializeAsString();
}